

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

saidx64_t * ss_partition(saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t depth)

{
  ulong uVar1;
  ulong *puVar2;
  
  puVar2 = (ulong *)(first + -1);
  do {
    while ((puVar2 = puVar2 + 1, puVar2 < last &&
           (uVar1 = *puVar2, PA[uVar1 + 1] < PA[uVar1] + depth))) {
      *puVar2 = ~uVar1;
    }
    do {
      last = (saidx64_t *)((ulong *)last + -1);
      if (last <= puVar2) {
        if (first < puVar2) {
          *first = ~*first;
        }
        return (saidx64_t *)puVar2;
      }
      uVar1 = *last;
    } while (PA[uVar1] + depth <= PA[uVar1 + 1]);
    *last = *puVar2;
    *puVar2 = ~uVar1;
  } while( true );
}

Assistant:

static INLINE
saidx_t *
ss_partition(const saidx_t *PA,
                    saidx_t *first, saidx_t *last, saidx_t depth) {
  saidx_t *a, *b;
  saidx_t t;
  for(a = first - 1, b = last;;) {
    for(; (++a < b) && ((PA[*a] + depth) >= (PA[*a + 1] + 1));) { *a = ~*a; }
    for(; (a < --b) && ((PA[*b] + depth) <  (PA[*b + 1] + 1));) { }
    if(b <= a) { break; }
    t = ~*b;
    *b = *a;
    *a = t;
  }
  if(first < a) { *first = ~*first; }
  return a;
}